

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void palette_reset(Terminal *term,_Bool keep_overrides)

{
  int iVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  char cVar6;
  long lVar5;
  uint8_t *puVar7;
  char cVar8;
  ulong uVar9;
  uint8_t uVar10;
  int *piVar11;
  int secondary;
  uint8_t uVar12;
  
  for (lVar5 = 0x1572; lVar5 != 0x1678; lVar5 = lVar5 + 1) {
    *(undefined1 *)((long)&term->compatibility_level + lVar5) = 1;
  }
  piVar11 = colour_indices_conf_to_osc4;
  for (lVar5 = 0; lVar5 != 0x42; lVar5 = lVar5 + 3) {
    iVar1 = *piVar11;
    secondary = (int)lVar5;
    iVar4 = conf_get_int_int(term->conf,0x95,secondary);
    term->subpalettes[0].values[iVar1].r = (uint8_t)iVar4;
    iVar4 = conf_get_int_int(term->conf,0x95,secondary + 1);
    term->subpalettes[0].values[iVar1].g = (uint8_t)iVar4;
    iVar4 = conf_get_int_int(term->conf,0x95,secondary + 2);
    term->subpalettes[0].values[iVar1].b = (uint8_t)iVar4;
    piVar11 = piVar11 + 1;
  }
  puVar7 = &term->subpalettes[0].values[0x10].b;
  cVar8 = '7';
  uVar9 = 0;
  while( true ) {
    cVar2 = (char)(((ushort)uVar9 & 0xff) / 6);
    if (uVar9 == 0xd8) break;
    uVar10 = cVar2 * '\x10' + cVar8;
    uVar3 = (ushort)uVar9 & 0xff;
    cVar6 = (char)((uVar3 / 6) % 6);
    uVar12 = (char)(uVar3 / 0x24) * '(' + '7';
    if (uVar9 < 0x24) {
      uVar12 = '\0';
    }
    ((rgb *)(puVar7 + -2))->r = uVar12;
    uVar12 = cVar6 * '(' + '7';
    if (cVar6 == '\0') {
      uVar12 = '\0';
    }
    puVar7[-1] = uVar12;
    if ((char)((char)uVar9 + cVar2 * -6) == '\0') {
      uVar10 = '\0';
    }
    *puVar7 = uVar10;
    uVar9 = uVar9 + 1;
    cVar8 = cVar8 + '(';
    puVar7 = puVar7 + 3;
  }
  cVar8 = '\b';
  for (lVar5 = 0x151a; lVar5 != 0x1562; lVar5 = lVar5 + 3) {
    *(char *)((long)&term->compatibility_level + lVar5) = cVar8;
    *(char *)((long)term + lVar5 + -1) = cVar8;
    *(char *)((long)term + lVar5 + -2) = cVar8;
    cVar8 = cVar8 + '\n';
  }
  for (lVar5 = 0x198a; lVar5 != 0x1a90; lVar5 = lVar5 + 1) {
    *(undefined1 *)((long)&term->compatibility_level + lVar5) = 0;
  }
  (*term->win->vt->palette_get_overrides)(term->win,term);
  if (!keep_overrides) {
    for (lVar5 = -0x106; lVar5 != 0; lVar5 = lVar5 + 1) {
      (&term->palette[0].r)[lVar5] = '\0';
    }
  }
  palette_rebuild(term);
  return;
}

Assistant:

static void palette_reset(Terminal *term, bool keep_overrides)
{
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_CONF].present[i] = true;

    /*
     * Copy all the palette information out of the Conf.
     */
    for (unsigned i = 0; i < CONF_NCOLOURS; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[
            colour_indices_conf_to_osc4[i]];
        col->r = conf_get_int_int(term->conf, CONF_colours, i*3+0);
        col->g = conf_get_int_int(term->conf, CONF_colours, i*3+1);
        col->b = conf_get_int_int(term->conf, CONF_colours, i*3+2);
    }

    /*
     * Directly invent the rest of the xterm-256 colours.
     */
    for (unsigned i = 0; i < 216; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 16];
        int r = i / 36, g = (i / 6) % 6, b = i % 6;
        col->r = r ? r * 40 + 55 : 0;
        col->g = g ? g * 40 + 55 : 0;
        col->b = b ? b * 40 + 55 : 0;
    }
    for (unsigned i = 0; i < 24; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 232];
        int shade = i * 10 + 8;
        col->r = col->g = col->b = shade;
    }

    /*
     * Re-fetch any OS-local overrides.
     */
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_PLATFORM].present[i] = false;
    win_palette_get_overrides(term->win, term);

    if (!keep_overrides) {
        /*
         * Get rid of all escape-sequence configuration.
         */
        for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
            term->subpalettes[SUBPAL_SESSION].present[i] = false;
    }

    /*
     * Rebuild the composite palette.
     */
    palette_rebuild(term);
}